

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeUnaryOp(ExpressionContext *ctx,SynUnaryOp *syntax)

{
  SynUnaryOpType type;
  undefined4 uVar1;
  TypeStruct *type_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ExprBase *arg0;
  char *pcVar5;
  size_t sVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeBase *pTVar8;
  undefined4 extraout_var_00;
  TypeBase **key;
  InplaceStr name;
  
  arg0 = AnalyzeExpression(ctx,syntax->value);
  if ((arg0->type == (TypeBase *)0x0) || (arg0->type->typeID != 0)) {
    uVar3 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
    if (3 < uVar3) {
LAB_001f1a3f:
      __assert_fail("index < N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x115,
                    "T &FixedArray<SmallDenseSet<TypeBase *, TypeBaseHasher, 4>, 4>::operator[](unsigned int) [T = SmallDenseSet<TypeBase *, TypeBaseHasher, 4>, N = 4]"
                   );
    }
    key = &arg0->type;
    bVar2 = SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains
                      ((ctx->noUnaryOperatorForTypePair).data + uVar3,key);
    if (!bVar2) {
      pcVar5 = GetOpName(*(SynUnaryOpType *)&(syntax->super_SynBase).field_0x3c);
      sVar6 = strlen(pcVar5);
      name.end = pcVar5 + sVar6;
      name.begin = pcVar5;
      pEVar7 = CreateFunctionCall1(ctx,&syntax->super_SynBase,name,arg0,true,false,true);
      if (pEVar7 != (ExprBase *)0x0) {
        return pEVar7;
      }
      uVar3 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
      if (3 < uVar3) goto LAB_001f1a3f;
      SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert
                ((ctx->noUnaryOperatorForTypePair).data + uVar3,key);
    }
    AssertValueExpression(ctx,&syntax->super_SynBase,arg0);
    type = *(SynUnaryOpType *)&(syntax->super_SynBase).field_0x3c;
    type_00 = (TypeStruct *)arg0->type;
    if (((TypeStruct *)ctx->typeFloat == type_00) || ((TypeStruct *)ctx->typeDouble == type_00)) {
      if (1 < type - SYN_UNARY_OP_BIT_NOT) {
LAB_001f19d4:
        if (type == SYN_UNARY_OP_LOGICAL_NOT) {
LAB_001f19da:
          key = &ctx->typeBool;
        }
        pTVar8 = *key;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        goto LAB_001f19fa;
      }
    }
    else if (((type_00 == (TypeStruct *)ctx->typeBool) || (type_00 == ctx->typeAutoRef)) ||
            ((type_00 != (TypeStruct *)0x0 && ((type_00->super_TypeBase).typeID == 0x12)))) {
      if (type == SYN_UNARY_OP_LOGICAL_NOT) goto LAB_001f19da;
    }
    else {
      bVar2 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type_00);
      if (bVar2) goto LAB_001f19d4;
    }
    pcVar5 = GetOpName(type);
    anon_unknown.dwarf_11255e::Report
              (ctx,&syntax->super_SynBase,
               "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar5,
               (ulong)(uint)(*(int *)&((*key)->name).end - (int)((*key)->name).begin));
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
LAB_001f19fa:
  uVar1 = *(undefined4 *)&(syntax->super_SynBase).field_0x3c;
  pEVar7->typeID = 0x13;
  pEVar7->source = &syntax->super_SynBase;
  pEVar7->type = pTVar8;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6830;
  *(undefined4 *)&pEVar7->field_0x2c = uVar1;
  pEVar7[1]._vptr_ExprBase = (_func_int **)arg0;
  return pEVar7;
}

Assistant:

ExprBase* AnalyzeUnaryOp(ExpressionContext &ctx, SynUnaryOp *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);

	if(!ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].contains(value->type))
	{
		if(ExprBase *result = CreateFunctionCall1(ctx, syntax, InplaceStr(GetOpName(syntax->type)), value, true, false, true))
			return result;
		else
			ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].insert(value->type);
	}

	AssertValueExpression(ctx, syntax, value);

	bool binaryOp = IsBinaryOp(syntax->type);
	bool logicalOp = IsLogicalOp(syntax->type);

	// Type check
	if(ctx.IsFloatingPointType(value->type))
	{
		if(binaryOp || logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(value->type == ctx.typeBool || value->type == ctx.typeAutoRef)
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(!ctx.IsNumericType(value->type))
	{
		Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
	}

	TypeBase *resultType = NULL;

	if(logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = value->type;

	return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, resultType, syntax->type, value);
}